

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_addsub.h
# Opt level: O0

uint32_t helper_usub8_arm(uint32_t a,uint32_t b,void *gep)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint32_t sum_3;
  uint32_t sum_2;
  uint32_t sum_1;
  uint32_t sum;
  uint32_t ge;
  uint32_t res;
  void *gep_local;
  uint32_t b_local;
  uint32_t a_local;
  
  uVar1 = (a & 0xff) - (b & 0xff);
  sum_1 = (uint32_t)(uVar1 >> 8 == 0);
  uVar2 = (a >> 8 & 0xff) - (b >> 8 & 0xff);
  if (uVar2 >> 8 == 0) {
    sum_1 = sum_1 | 2;
  }
  uVar3 = (a >> 0x10 & 0xff) - (b >> 0x10 & 0xff);
  if (uVar3 >> 8 == 0) {
    sum_1 = sum_1 | 4;
  }
  uVar4 = (a >> 0x18) - (b >> 0x18);
  if (uVar4 >> 8 == 0) {
    sum_1 = sum_1 | 8;
  }
  *(uint32_t *)gep = sum_1;
  return uVar4 * 0x1000000 | (uVar3 & 0xff) << 0x10 | (uVar2 & 0xff) << 8 | uVar1 & 0xff;
}

Assistant:

uint32_t HELPER(glue(PFX,sub8))(uint32_t a, uint32_t b GE_ARG)
{
    uint32_t res = 0;
    DECLARE_GE;

    SUB8(a, b, 0);
    SUB8(a >> 8, b >> 8, 1);
    SUB8(a >> 16, b >> 16, 2);
    SUB8(a >> 24, b >> 24, 3);
    SET_GE;
    return res;
}